

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O2

void logging_tests::logging_LogPrintMacros_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  pointer local_728;
  pointer local_720;
  char *local_718;
  char *local_710;
  pointer local_708;
  pointer local_700;
  char *local_6f8;
  char *local_6f0;
  pointer local_6e8;
  pointer local_6e0;
  char *local_6d8;
  char *local_6d0;
  pointer local_6c8;
  pointer local_6c0;
  char *local_6b8;
  char *local_6b0;
  pointer local_6a8;
  pointer local_6a0;
  char *local_698;
  char *local_690;
  basic_wrap_stringstream<char> local_688;
  logging_LogPrintMacros t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_690 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"logging_LogPrintMacros");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_6a8 = (pbVar3->_M_dataplus)._M_p;
  local_6a0 = local_6a8 + pbVar3->_M_string_length;
  file.m_end = (iterator)0x86;
  file.m_begin = (iterator)&local_698;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_6a8,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  LogSetup::LogSetup(&t.super_LogSetup);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_6b0 = "";
  memset(&local_688,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_688);
  std::operator<<((ostream *)&local_688,'\"');
  std::operator<<((ostream *)&local_688,"logging_LogPrintMacros");
  std::operator<<((ostream *)&local_688,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_688);
  local_6c8 = (pbVar3->_M_dataplus)._M_p;
  local_6c0 = local_6c8 + pbVar3->_M_string_length;
  file_00.m_end = (iterator)0x86;
  file_00.m_begin = (iterator)&local_6b8;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_6c8,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_688);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_6d0 = "";
  memset(&local_688,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_688);
  std::operator<<((ostream *)&local_688,'\"');
  std::operator<<((ostream *)&local_688,"logging_LogPrintMacros");
  std::operator<<((ostream *)&local_688,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_688);
  local_6e8 = (pbVar3->_M_dataplus)._M_p;
  local_6e0 = local_6e8 + pbVar3->_M_string_length;
  file_01.m_end = (iterator)0x86;
  file_01.m_begin = (iterator)&local_6d8;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_6e8,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_688);
  logging_LogPrintMacros::test_method(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_6f0 = "";
  memset(&local_688,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_688);
  std::operator<<((ostream *)&local_688,'\"');
  std::operator<<((ostream *)&local_688,"logging_LogPrintMacros");
  std::operator<<((ostream *)&local_688,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_688);
  local_708 = (pbVar3->_M_dataplus)._M_p;
  local_700 = local_708 + pbVar3->_M_string_length;
  file_02.m_end = (iterator)0x86;
  file_02.m_begin = (iterator)&local_6f8;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_708,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_688);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_718 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_710 = "";
  memset(&local_688,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_688);
  std::operator<<((ostream *)&local_688,'\"');
  std::operator<<((ostream *)&local_688,"logging_LogPrintMacros");
  std::operator<<((ostream *)&local_688,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_688);
  local_728 = (pbVar3->_M_dataplus)._M_p;
  local_720 = local_728 + pbVar3->_M_string_length;
  file_03.m_end = (iterator)0x86;
  file_03.m_begin = (iterator)&local_718;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_728,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_688);
  LogSetup::~LogSetup(&t.super_LogSetup);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(logging_LogPrintMacros, LogSetup)
{
    LogTrace(BCLog::NET, "foo6: %s\n", "bar6"); // not logged
    LogDebug(BCLog::NET, "foo7: %s\n", "bar7");
    LogInfo("foo8: %s\n", "bar8");
    LogWarning("foo9: %s\n", "bar9");
    LogError("foo10: %s\n", "bar10");
    std::ifstream file{tmp_log_path};
    std::vector<std::string> log_lines;
    for (std::string log; std::getline(file, log);) {
        log_lines.push_back(log);
    }
    std::vector<std::string> expected = {
        "[net] foo7: bar7",
        "foo8: bar8",
        "[warning] foo9: bar9",
        "[error] foo10: bar10",
    };
    BOOST_CHECK_EQUAL_COLLECTIONS(log_lines.begin(), log_lines.end(), expected.begin(), expected.end());
}